

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

optional<std::string> * __thiscall
Commands::find_entity_name_abi_cxx11_
          (optional<std::string> *__return_storage_ptr__,Commands *this,EntityType type)

{
  _Rb_tree_node_base *p_Var1;
  undefined6 in_register_00000012;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT62(in_register_00000012,type) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NONE",&local_39);
    std::experimental::
    optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional_base(&__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>,
                    &local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    for (p_Var1 = (this->entities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->entities)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      if ((short)p_Var1[2]._M_color == type) {
        std::experimental::
        optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::optional_base(&__return_storage_ptr__->
                         super_OptionalBase<std::__cxx11::basic_string<char>_>,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var1 + 1));
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).init_ = false;
    (__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).storage_.dummy_
         = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> Commands::find_entity_name(EntityType type) const
{
    if(type == 0)
        return std::string("NONE");

    for(auto& pair : this->entities)
    {
        if(pair.second == type)
            return pair.first;
    }

    return nullopt;
}